

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::btAxisSweep3Internal
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *worldAabbMin,btVector3 *worldAabbMax,
          uint handleMask,uint handleSentinel,uint userMaxHandles,btOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Edge *pEVar4;
  btHashedOverlappingPairCache *this_00;
  btOverlappingPairCache *pbVar5;
  btDbvtBroadphase *this_01;
  Handle *pHVar6;
  void *pvVar7;
  int *piVar8;
  Handle *pHVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  uVar16 = in_XMM1._4_4_;
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btAxisSweep3Internal_00222db0;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (btOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (btDbvtBroadphase *)0x0;
  if (pairCache == (btOverlappingPairCache *)0x0) {
    this_00 = (btHashedOverlappingPairCache *)btAlignedAllocInternal(0x78,0x10);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(this_00);
    this->m_pairCache = (btOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  uVar1 = userMaxHandles + 1;
  if (!disableRaycastAccelerator) {
    pbVar5 = (btOverlappingPairCache *)btAlignedAllocInternal(0x28,0x10);
    (pbVar5->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar5[1].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar5[4].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar5[2].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar5[3].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    (pbVar5->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback =
         (_func_int **)&PTR__btNullPairCache_00222ce8;
    *(undefined1 *)&pbVar5[4].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = 1;
    pbVar5[3].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    *(undefined4 *)
     ((long)&pbVar5[1].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback + 4) = 0;
    *(undefined4 *)&pbVar5[2].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = 0;
    this->m_nullPairCache = pbVar5;
    this_01 = (btDbvtBroadphase *)btAlignedAllocInternal(0x120,0x10);
    btDbvtBroadphase::btDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar2 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar2;
  fVar14 = (float)this->m_handleSentinel;
  uVar2 = *(undefined8 *)(this->m_worldAabbMax).m_floats;
  uVar3 = *(undefined8 *)(this->m_worldAabbMin).m_floats;
  auVar19._0_4_ = (float)uVar2 - (float)uVar3;
  auVar19._4_4_ = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar3 >> 0x20);
  auVar19._8_8_ = 0;
  auVar22._4_4_ = uVar16;
  auVar22._0_4_ = fVar14;
  auVar22._8_4_ = uVar16;
  auVar22._12_4_ = uVar16;
  auVar18._8_8_ = auVar22._8_8_;
  auVar18._4_4_ = fVar14;
  auVar18._0_4_ = fVar14;
  auVar19 = divps(auVar18,auVar19);
  auVar20._0_8_ = auVar19._0_8_;
  auVar20._8_4_ = fVar14 / ((this->m_worldAabbMax).m_floats[2] - (this->m_worldAabbMin).m_floats[2])
  ;
  auVar20._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar20;
  uVar12 = (ulong)uVar1;
  pHVar6 = (Handle *)btAlignedAllocInternal(uVar12 * 0x60,0x10);
  if (uVar1 != 0) {
    pHVar9 = pHVar6;
    do {
      (pHVar9->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
      (pHVar9->super_btBroadphaseProxy).m_multiSapParentProxy = (void *)0x0;
      pHVar9 = pHVar9 + 1;
    } while (pHVar9 != pHVar6 + uVar12);
  }
  this->m_pHandles = pHVar6;
  this->m_maxHandles = uVar1;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 1;
  auVar18 = _DAT_001f55c0;
  auVar19 = _DAT_001f5270;
  if (1 < uVar1) {
    lVar11 = uVar12 - 2;
    auVar13._8_4_ = (int)lVar11;
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
    piVar8 = (int *)&pHVar6[1].super_btBroadphaseProxy.field_0x3c;
    iVar15 = 1;
    iVar17 = 2;
    uVar10 = 0;
    auVar13 = auVar13 ^ _DAT_001f5270;
    do {
      auVar21._8_4_ = (int)uVar10;
      auVar21._0_8_ = uVar10;
      auVar21._12_4_ = (int)(uVar10 >> 0x20);
      auVar22 = (auVar21 | auVar18) ^ auVar19;
      if ((bool)(~(auVar22._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar22._0_4_ ||
                  auVar13._4_4_ < auVar22._4_4_) & 1)) {
        *piVar8 = iVar15 + 1;
      }
      if ((auVar22._12_4_ != auVar13._12_4_ || auVar22._8_4_ <= auVar13._8_4_) &&
          auVar22._12_4_ <= auVar13._12_4_) {
        piVar8[0x18] = iVar17 + 1;
      }
      uVar10 = uVar10 + 2;
      iVar15 = iVar15 + 2;
      iVar17 = iVar17 + 2;
      piVar8 = piVar8 + 0x30;
    } while ((uVar1 & 0xfffffffe) != uVar10);
  }
  *(undefined4 *)&pHVar6[userMaxHandles].super_btBroadphaseProxy.field_0x3c = 0;
  lVar11 = -3;
  do {
    pvVar7 = btAlignedAllocInternal(uVar12 << 4,0x10);
    this->m_pEdgesRawPtr[lVar11 + 3] = pvVar7;
    this->m_pEdgesRawPtr[lVar11] = pvVar7;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  pHVar6 = this->m_pHandles;
  (pHVar6->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
  lVar11 = 0;
  do {
    *(undefined4 *)((long)(&(pHVar6->super_btBroadphaseProxy).m_aabbMax + 1) + lVar11 * 4) = 0;
    pHVar6->m_maxEdges[lVar11] = 1;
    pEVar4 = this->m_pEdges[lVar11];
    pEVar4->m_pos = 0;
    pEVar4->m_handle = 0;
    pEVar4[1].m_pos = this->m_handleSentinel;
    pEVar4[1].m_handle = 0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  return;
}

Assistant:

btAxisSweep3Internal<BP_FP_INT_TYPE>::btAxisSweep3Internal(const btVector3& worldAabbMin,const btVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel,BP_FP_INT_TYPE userMaxHandles, btOverlappingPairCache* pairCache , bool disableRaycastAccelerator)
:m_bpHandleMask(handleMask),
m_handleSentinel(handleSentinel),
m_pairCache(pairCache),
m_userPairCallback(0),
m_ownsPairCache(false),
m_invalidPair(0),
m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles+1);//need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new(ptr) btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (btAlignedAlloc(sizeof(btNullPairCache),16)) btNullPairCache();
		m_raycastAccelerator = new (btAlignedAlloc(sizeof(btDbvtBroadphase),16)) btDbvtBroadphase(m_nullPairCache);//m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;//don't add/remove pairs
	}

	//btAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	btVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE	maxInt = m_handleSentinel;

	m_quantize = btVector3(btScalar(maxInt),btScalar(maxInt),btScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using btAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];
	
	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = btAlignedAlloc(sizeof(Edge)*maxHandles*2,16);
			m_pEdges[i] = new(m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels
	
	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

	}

}